

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.h
# Opt level: O2

Worker * lace_steal(WorkerP *self,Task *__dq_head,Worker *victim)

{
  TailSplit TVar1;
  Task *pTVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((victim != (Worker *)0x0) && (victim->allstolen == '\0')) {
    TVar1 = (TailSplit)(victim->ts).v.super___atomic_base<unsigned_long>._M_i;
    if (TVar1._0_4_ < TVar1._4_4_) {
      LOCK();
      bVar4 = TVar1 == victim->ts;
      if (bVar4) {
        victim->ts = (TailSplit)((ulong)(TVar1._0_4_ + 1) | (ulong)TVar1 & 0xffffffff00000000);
      }
      UNLOCK();
      if (!bVar4) {
        return (Worker *)0x1;
      }
      pTVar2 = victim->dq;
      uVar3 = (ulong)TVar1 & 0xffffffff;
      pTVar2[uVar3].thief._M_b._M_p = self->_public;
      (*pTVar2[uVar3].f)(self,__dq_head,pTVar2 + uVar3);
      pTVar2[uVar3].thief._M_b._M_p = (__pointer_type)0x2;
      return (Worker *)0x0;
    }
    if (victim->movesplit == '\0') {
      victim->movesplit = '\x01';
      return (Worker *)0x2;
    }
  }
  return (Worker *)0x2;
}

Assistant:

lace_steal(WorkerP *self, Task *__dq_head, Worker *victim)
{
    if (victim != NULL && !victim->allstolen) {
        TailSplitNA ts;
        ts.v = victim->ts.v;
        if (ts.ts.tail < ts.ts.split) {
            TailSplitNA ts_new;
            ts_new.v = ts.v;
            ts_new.ts.tail++;
            if (atomic_compare_exchange_weak(&victim->ts.v, &ts.v, ts_new.v)) {
                // Stolen
                Task *t = &victim->dq[ts.ts.tail];
                atomic_store_explicit(&t->thief, self->_public, memory_order_relaxed);
                lace_time_event(self, 1);
                t->f(self, __dq_head, t);
                lace_time_event(self, 2);
                atomic_store_explicit(&t->thief, THIEF_COMPLETED, memory_order_release);
                lace_time_event(self, 8);
                return LACE_STOLEN;
            }

            lace_time_event(self, 7);
            return LACE_BUSY;
        }

        if (victim->movesplit == 0) {
            victim->movesplit = 1;
            PR_COUNTSPLITS(self, CTR_split_req);
        }
    }

    lace_time_event(self, 7);
    return LACE_NOWORK;
}